

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O1

void __thiscall MeterPrivate::drawRanges(MeterPrivate *this,QPainter *painter,DrawParams *params)

{
  uint uVar1;
  QMapData<std::multimap<int,_MeterPrivate::RangeData,_std::less<int>,_std::allocator<std::pair<const_int,_MeterPrivate::RangeData>_>_>_>
  *pQVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  double dVar5;
  QRectF r;
  QBrush local_60 [8];
  QPen local_58 [8];
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  uVar1 = this->startScaleAngle;
  params->scaleDegree = (double)(this->stopScaleAngle - uVar1);
  params->startScaleAngle = (double)uVar1;
  dVar5 = (double)this->radius;
  params->margin = dVar5 / 20.0;
  params->scaleWidth = dVar5 / 30.0;
  params->gridLabelSize = dVar5 / 10.0;
  params->fontPixelSize = (dVar5 / 10.0) * 0.75;
  local_38 = (dVar5 / 30.0) * 0.5 + dVar5 / 20.0;
  local_50 = (params->rect).xp + local_38;
  local_48 = (params->rect).yp + local_38;
  local_40 = ((params->rect).w - local_38) - local_38;
  local_38 = ((params->rect).h - local_38) - local_38;
  QPainter::save();
  pQVar2 = (this->ranges).d.d;
  if (pQVar2 == (QMapData<std::multimap<int,_MeterPrivate::RangeData,_std::less<int>,_std::allocator<std::pair<const_int,_MeterPrivate::RangeData>_>_>_>
                 *)0x0) {
    p_Var3 = (_Base_ptr)0x0;
  }
  else {
    p_Var3 = (pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  p_Var4 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar2 == (QMapData<std::multimap<int,_MeterPrivate::RangeData,_std::less<int>,_std::allocator<std::pair<const_int,_MeterPrivate::RangeData>_>_>_>
                 *)0x0) {
    p_Var4 = (_Base_ptr)0x0;
  }
  if (p_Var3 != p_Var4) {
    do {
      QBrush::QBrush(local_60,&p_Var3[1]._M_right,1);
      QPen::QPen((QPen *)params->scaleWidth,local_58,local_60,1,0x10,0x40);
      QPainter::setPen((QPen *)painter);
      QPen::~QPen(local_58);
      QBrush::~QBrush(local_60);
      QPainter::drawArc((QRectF *)painter,(int)&local_50,
                        (int)((-90.0 - (((double)p_Var3[1]._M_parent /
                                        (this->maxValue - this->minValue)) * params->scaleDegree +
                                       params->startScaleAngle)) * 16.0));
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != p_Var4);
  }
  QPainter::restore();
  return;
}

Assistant:

void
MeterPrivate::drawRanges( QPainter & painter, DrawParams & params )
{
	params.scaleDegree = stopScaleAngle - startScaleAngle;
	params.startScaleAngle = startScaleAngle;
	params.margin = radius / 20.0;

	const qreal gridLabelSizeFactor = 10.0;

	params.scaleWidth = radius / ( gridLabelSizeFactor + 20.0 );
	params.gridLabelSize = radius / gridLabelSizeFactor;
	params.fontPixelSize = params.gridLabelSize * 0.75;

	const qreal m = params.margin + params.scaleWidth / 2.0;

	const QRectF r = params.rect - QMarginsF( m, m, m,m );

	painter.save();

	for( auto it = ranges.cbegin(), last = ranges.cend(); it != last; ++it )
	{
		painter.setPen( QPen( it.value().color, params.scaleWidth ) );
		const qreal angle = params.startScaleAngle +
			params.scaleDegree * ( it.value().start / ( maxValue - minValue ) );
		const qreal span = params.startScaleAngle +
			params.scaleDegree * ( it.value().stop / ( maxValue - minValue ) ) - angle;
		painter.drawArc( r, ( -90.0 - angle ) * 16, -span * 16 );
	}

	painter.restore();
}